

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O0

void address_space_stw_internal_cached_slow_x86_64
               (uc_struct_conflict *uc,MemoryRegionCache *cache,hwaddr addr,uint32_t val,
               MemTxAttrs attrs,MemTxResult *result,device_endian endian)

{
  hwaddr mr_00;
  MemoryRegionCache *uc_00;
  _Bool _Var1;
  MemOp MVar2;
  ulong data;
  uint16_t v;
  MemTxResult local_5c;
  _Bool release_lock;
  ram_addr_t rStack_58;
  MemTxResult r;
  hwaddr addr1;
  hwaddr l;
  MemoryRegion *mr;
  uint8_t *ptr;
  MemTxResult *result_local;
  hwaddr hStack_28;
  uint32_t val_local;
  hwaddr addr_local;
  MemoryRegionCache *cache_local;
  uc_struct_conflict *uc_local;
  MemTxAttrs attrs_local;
  
  addr1 = 2;
  ptr = (uint8_t *)result;
  result_local._4_4_ = val;
  hStack_28 = addr;
  addr_local = (hwaddr)cache;
  cache_local = (MemoryRegionCache *)uc;
  uc_local._4_4_ = attrs;
  l = (hwaddr)address_space_translate_cached(cache,addr,&stack0xffffffffffffffa8,&addr1,true,attrs);
  if (1 < addr1) {
    _Var1 = memory_access_is_direct((MemoryRegion *)l,true);
    if (_Var1) {
      mr = (MemoryRegion *)
           qemu_map_ram_ptr_x86_64
                     (*(uc_struct_conflict **)(l + 0x80),*(RAMBlock **)(l + 8),rStack_58);
      v = (uint16_t)result_local._4_4_;
      if (endian == DEVICE_BIG_ENDIAN) {
        stw_be_p(mr,v);
      }
      else if (endian == DEVICE_LITTLE_ENDIAN) {
        stw_le_p(mr,v);
      }
      else {
        stw_le_p(mr,v);
      }
      invalidate_and_set_dirty((MemoryRegion *)l,rStack_58,2);
      local_5c = 0;
      goto LAB_004b8a19;
    }
  }
  prepare_mmio_access((MemoryRegion *)l);
  uc_00 = cache_local;
  mr_00 = l;
  data = (ulong)result_local._4_4_;
  MVar2 = devend_memop(endian);
  local_5c = memory_region_dispatch_write_x86_64
                       ((uc_struct_conflict *)uc_00,(MemoryRegion *)mr_00,rStack_58,data,
                        MVar2 | MO_16,uc_local._4_4_);
LAB_004b8a19:
  if (ptr != (uint8_t *)0x0) {
    *(MemTxResult *)ptr = local_5c;
  }
  return;
}

Assistant:

static inline void glue(address_space_stw_internal, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs,
    MemTxResult *result, enum device_endian endian)
{
    uint8_t *ptr;
    MemoryRegion *mr;
    hwaddr l = 2;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, true, attrs);
    if (l < 2 || !memory_access_is_direct(mr, true)) {
        release_lock |= prepare_mmio_access(mr);
        r = memory_region_dispatch_write(uc, mr, addr1, val,
                                         MO_16 | devend_memop(endian), attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        switch (endian) {
        case DEVICE_LITTLE_ENDIAN:
            stw_le_p(ptr, val);
            break;
        case DEVICE_BIG_ENDIAN:
            stw_be_p(ptr, val);
            break;
        default:
            stw_p(ptr, val);
            break;
        }
        invalidate_and_set_dirty(mr, addr1, 2);
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
}